

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IsGroupOf_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::IsGroupOf_PDU::IsGroupOf_PDU
          (IsGroupOf_PDU *this,EntityIdentifier *EI,KFLOAT64 GrpLatitude,KFLOAT64 GrpLongitude,
          GEDList *GED)

{
  KUINT16 KVar1;
  
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__IsGroupOf_PDU_00229fa0;
  (this->m_GroupedEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00223e28;
  KVar1 = (EI->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->m_GroupedEntityID).super_SimulationIdentifier.m_ui16SiteID =
       (EI->super_SimulationIdentifier).m_ui16SiteID;
  (this->m_GroupedEntityID).super_SimulationIdentifier.m_ui16ApplicationID = KVar1;
  (this->m_GroupedEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_00223cc8;
  *(undefined2 *)&(this->m_GroupedEntityID).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(EI->super_SimulationIdentifier).field_0xc;
  this->m_ui32Padding1 = 0;
  this->m_f64GrpLat = GrpLatitude;
  this->m_f64GrpLon = GrpLongitude;
  (this->m_vpGED).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vpGED).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vpGED).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\x06';
  (this->super_Header).super_Header6.m_ui8PDUType = '\"';
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\a';
  SetGED(this,GED);
  return;
}

Assistant:

IsGroupOf_PDU::IsGroupOf_PDU(const EntityIdentifier &EI, KFLOAT64 GrpLatitude, KFLOAT64 GrpLongitude,
                             const GEDList &GED) noexcept(false) :
    m_GroupedEntityID( EI ),
    m_ui32Padding1( 0 ),
    m_f64GrpLat( GrpLatitude ),
    m_f64GrpLon( GrpLongitude )
{
    m_ui8ProtocolVersion = IEEE_1278_1A_1998;
    m_ui8ProtocolFamily = EntityManagement;
    m_ui8PDUType = IsGroupOf_PDU_Type;

    try
    {
        SetGED( GED );
    }
    catch( const std::exception & e )
    {
        m_ui8NumOfGroupedEnts = 0;
        throw;
    }
}